

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::recomputeSurpluses<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this)

{
  pointer *this_00;
  pointer *this_01;
  pointer *ppvVar1;
  double dVar2;
  int new_num_strips;
  int iVar3;
  const_iterator __first;
  const_iterator __last;
  reference piVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  double *pdVar8;
  int *piVar9;
  double *pdVar10;
  reference pvVar11;
  MultiIndexSet *pMVar12;
  StorageSet *this_02;
  int local_1d4;
  int k;
  double v;
  double *col_strip;
  int ix;
  int ijx;
  int im;
  int row;
  double *row_strip;
  int local_1a0;
  int i;
  int job;
  int d;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  lines1d;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  map;
  vector<double,_std::allocator<double>_> vvals;
  vector<int,_std::allocator<int>_> vindx;
  vector<int,_std::allocator<int>_> vpntr;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  int local_108;
  undefined4 local_104;
  int num_nodes;
  vector<int,_std::allocator<int>_> level_1;
  Data2D<int> dagUp;
  undefined1 local_b8 [7];
  bool is_complete;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> dagUp_1;
  allocator<double> local_61;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  vector<double,_std::allocator<double>_> local_50;
  Data2D<double> local_38;
  GridLocalPolynomial *local_10;
  GridLocalPolynomial *this_local;
  
  iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
  local_10 = this;
  new_num_strips = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  this_02 = &(this->super_BaseCanonicalGrid).values;
  local_58._M_current = (double *)StorageSet::begin(this_02);
  local_60._M_current = (double *)StorageSet::end(this_02);
  ::std::allocator<double>::allocator(&local_61);
  ::std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_50,local_58,local_60,&local_61);
  Data2D<double>::Data2D<int,int>(&local_38,iVar3,new_num_strips,&local_50);
  Data2D<double>::operator=(&this->surpluses,&local_38);
  Data2D<double>::~Data2D(&local_38);
  ::std::vector<double,_std::allocator<double>_>::~vector(&local_50);
  ::std::allocator<double>::~allocator(&local_61);
  if (((this->super_BaseCanonicalGrid).num_dimensions < 3) ||
     (((this->super_BaseCanonicalGrid).num_dimensions == 3 &&
      (iVar3 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points),
      2000000 < iVar3)))) {
    pMVar12 = &(this->super_BaseCanonicalGrid).points;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>
              ((Data2D<int> *)
               &level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,pMVar12);
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>
              ((vector<int,_std::allocator<int>_> *)local_b8,pMVar12);
    updateSurpluses<(TasGrid::RuleLocal::erule)3>
              (this,&(this->super_BaseCanonicalGrid).points,this->top_level,
               (vector<int,_std::allocator<int>_> *)local_b8,
               (Data2D<int> *)
               &level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8)
    ;
    Data2D<int>::~Data2D
              ((Data2D<int> *)
               &level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  else {
    dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>
              ((Data2D<int> *)
               &level_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&(this->super_BaseCanonicalGrid).points,
               (bool *)((long)&dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
    if ((dagUp.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._7_1_ & 1) == 0) {
      HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>
                ((vector<int,_std::allocator<int>_> *)&num_nodes,
                 &(this->super_BaseCanonicalGrid).points);
      updateSurpluses<(TasGrid::RuleLocal::erule)3>
                (this,&(this->super_BaseCanonicalGrid).points,this->top_level,
                 (vector<int,_std::allocator<int>_> *)&num_nodes,
                 (Data2D<int> *)
                 &level_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_104 = 1;
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&num_nodes);
    }
    else {
      pMVar12 = &(this->super_BaseCanonicalGrid).points;
      __first = MultiIndexSet::begin(pMVar12);
      __last = MultiIndexSet::end(pMVar12);
      local_110 = ::std::
                  max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                            (__first._M_current,__last._M_current);
      piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_110);
      local_108 = *piVar4 + 1;
      this_00 = &vindx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
      ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_00)
      ;
      this_01 = &vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_01)
      ;
      ppvVar1 = &map.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)ppvVar1);
      RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)3>
                (this->order,local_108,(vector<int,_std::allocator<int>_> *)this_00,
                 (vector<int,_std::allocator<int>_> *)this_01,
                 (vector<double,_std::allocator<double>_> *)ppvVar1);
      ppvVar1 = &lines1d.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)ppvVar1);
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&job);
      MultiIndexManipulations::resortIndexes
                (&(this->super_BaseCanonicalGrid).points,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)ppvVar1,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&job);
      i = (this->super_BaseCanonicalGrid).num_dimensions;
      while (i = i + -1, -1 < i) {
        local_1a0 = 0;
        while( true ) {
          pvVar5 = ::std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&job,(long)i);
          sVar6 = ::std::vector<int,_std::allocator<int>_>::size(pvVar5);
          if ((int)sVar6 + -1 <= local_1a0) break;
          pvVar5 = ::std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&job,(long)i);
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)local_1a0);
          row_strip._4_4_ = *pvVar7;
          while( true ) {
            row_strip._4_4_ = row_strip._4_4_ + 1;
            pvVar5 = ::std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&job,(long)i);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar5,(long)(local_1a0 + 1));
            if (*pvVar7 <= row_strip._4_4_) break;
            pvVar5 = ::std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&lines1d.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar5,(long)row_strip._4_4_);
            pdVar8 = Data2D<double>::getStrip(&this->surpluses,*pvVar7);
            pvVar5 = ::std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&lines1d.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar5,(long)row_strip._4_4_);
            piVar9 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,*pvVar7);
            iVar3 = piVar9[i];
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &vindx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)iVar3);
            ix = *pvVar7;
            pvVar5 = ::std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&job,(long)i);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)local_1a0);
            col_strip._4_4_ = *pvVar7;
            pvVar5 = ::std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)&lines1d.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)i);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar5,(long)col_strip._4_4_);
            piVar9 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,*pvVar7);
            col_strip._0_4_ = piVar9[i];
            while (pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       &vvals.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,(long)ix),
                  *pvVar7 < iVar3 || (int)col_strip < iVar3) {
              pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,(long)ix);
              if (*pvVar7 < (int)col_strip) {
                ix = ix + 1;
              }
              else {
                pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    &vvals.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,(long)ix);
                if ((int)col_strip < *pvVar7) {
                  pvVar5 = ::std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)&lines1d.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (long)i);
                  pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                     (pvVar5,(long)(col_strip._4_4_ + 1));
                  piVar9 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,*pvVar7);
                  col_strip._0_4_ = piVar9[i];
                }
                else {
                  pvVar5 = ::std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)&lines1d.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (long)i);
                  pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                     (pvVar5,(long)col_strip._4_4_);
                  pdVar10 = Data2D<double>::getStrip(&this->surpluses,*pvVar7);
                  pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)
                                       &map.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ix)
                  ;
                  dVar2 = *pvVar11;
                  for (local_1d4 = 0; local_1d4 < (this->super_BaseCanonicalGrid).num_outputs;
                      local_1d4 = local_1d4 + 1) {
                    pdVar8[local_1d4] = -dVar2 * pdVar10[local_1d4] + pdVar8[local_1d4];
                  }
                  ix = ix + 1;
                  pvVar5 = ::std::
                           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         *)&lines1d.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (long)i);
                  pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                     (pvVar5,(long)(col_strip._4_4_ + 1));
                  piVar9 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,*pvVar7);
                  col_strip._0_4_ = piVar9[i];
                }
                col_strip._4_4_ = col_strip._4_4_ + 1;
              }
            }
          }
          local_1a0 = local_1a0 + 1;
        }
      }
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&job);
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&lines1d.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &map.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &vvals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &vindx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_104 = 0;
    }
    Data2D<int>::~Data2D
              ((Data2D<int> *)
               &level_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void GridLocalPolynomial::recomputeSurpluses() {
    surpluses = Data2D<double>(num_outputs, points.getNumIndexes(), std::vector<double>(values.begin(), values.end()));

    // There are two available algorithms here:
    // - global sparse Kronecker (kron), implemented here in recomputeSurpluses()
    // - sparse matrix in matrix-free form (mat), implemented in updateSurpluses()
    //
    // (kron) has the additional restriction that it will only work when the hierarchy is complete
    // i.e., all point (multi-indexes) have all of their parents
    // this is guaranteed for a full-tensor grid, non-adaptive grid, or a grid adapted with the stable refinement strategy
    // other refinement strategies or using dynamic refinement (even with a stable refinement strategy)
    // may yield a hierarchy-complete grid, but this is not mathematically guaranteed
    //
    // computing the dagUp allows us to check (at runtime) if the grid is_complete, and exclude (kron) if incomplete
    //    the completeness check can be done on the fly but it does incur cost
    //
    // approximate computational cost, let n be the number of points and d be the number of dimensions
    // (kron) d n n^(1/d) due to standard Kronecker reasons, except it is hard to find the "effective" n due to sparsity
    // (mat) d^2 n log(n) since there are d log(n) ancestors and basis functions are product of d one dimensional functions
    //    naturally, there are constants and those also depend on the system, e.g., number of threads, thread scheduling, cache ...
    //    (mat) has a more even load per thread and parallelizes better
    //
    // for d = 1, the algorithms are the same, except (kron) explicitly forms the matrix and the matrix free (mat) version is much better
    // for d = 2, the (mat) algorithm is still faster
    // for d = 3, and sufficiently large size the (mat) algorithm still wins
    //            the breaking point depends on n, the order and system
    // for d = 4 and above, the (kron) algorithm is much faster
    //           it is possible that for sufficiently large n (mat) will win again
    //           but tested on 12 cores CPUs (Intel and AMD) up to n = 3.5 million, the (kron) method is over 2x faster
    // higher dimensions will favor (kron) even more

    if (num_dimensions <= 2 or (num_dimensions == 3 and points.getNumIndexes() > 2000000)) {
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    bool is_complete = true;
    Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points, is_complete);

    if (not is_complete) {
        // incomplete hierarchy, must use the slow algorithm
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    int num_nodes = 1 + *std::max_element(points.begin(), points.end());

    std::vector<int> vpntr, vindx;
    std::vector<double> vvals;
    RuleLocal::van_matrix<effrule>(order, num_nodes, vpntr, vindx, vvals);

    std::vector<std::vector<int>> map;
    std::vector<std::vector<int>> lines1d;
    MultiIndexManipulations::resortIndexes(points, map, lines1d);

    for(int d=num_dimensions-1; d>=0; d--) {
        #pragma omp parallel for schedule(dynamic)
        for(int job = 0; job < static_cast<int>(lines1d[d].size() - 1); job++) {
            for(int i=lines1d[d][job]+1; i<lines1d[d][job+1]; i++) {
                double *row_strip = surpluses.getStrip(map[d][i]);

                int row = points.getIndex(map[d][i])[d];
                int im  = vpntr[row];
                int ijx = lines1d[d][job];
                int ix  = points.getIndex(map[d][ijx])[d];

                while(vindx[im] < row or ix < row) {
                    if (vindx[im] < ix) {
                        ++im; // move the index of the matrix pattern (missing entry)
                    } else if (ix < vindx[im]) {
                        // entry not connected, move to the next one
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    } else {
                        double const *col_strip = surpluses.getStrip(map[d][ijx]);
                        double const v = vvals[im];
                        for(int k=0; k<num_outputs; k++)
                            row_strip[k] -= v * col_strip[k];

                        ++im;
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    }
                }
            }
        }
    }
}